

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

bool __thiscall node::anon_unknown_2::ChainImpl::isReadyToBroadcast(ChainImpl *this)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  ChainstateManager *pCVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar4 = chainman(this);
  if ((((pCVar4->m_blockman).m_importing._M_base._M_i & 1U) == 0) &&
     (((pCVar4->m_blockman).m_blockfiles_indexed._M_base._M_i & 1U) != 0)) {
    iVar3 = (*(this->super_Chain)._vptr_Chain[0x23])(this);
    bVar2 = (byte)iVar3 ^ 1;
  }
  else {
    bVar2 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool isReadyToBroadcast() override { return !chainman().m_blockman.LoadingBlocks() && !isInitialBlockDownload(); }